

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O2

void __thiscall PluginFverb::clear(PluginFverb *this)

{
  float fVar1;
  
  Fverb::clear((this->fDsp)._M_t.super___uniq_ptr_impl<Fverb,_std::default_delete<Fverb>_>._M_t.
               super__Tuple_impl<0UL,_Fverb_*,_std::default_delete<Fverb>_>.
               super__Head_base<0UL,_Fverb_*,_false>._M_head_impl);
  fVar1 = (this->fWet).target;
  (this->fDry).mem = (this->fDry).target;
  (this->fWet).mem = fVar1;
  WDL_Resampler::Reset(&this->fDownsampler,(FractionTop)0x0);
  WDL_Resampler::Reset(&this->fUpsampler,(FractionTop)0x0);
  *(undefined8 *)(this->fLastDspOutputs)._M_elems = 0;
  return;
}

Assistant:

void PluginFverb::clear()
{
    fDsp->clear();

    fDry.clearToTarget();
    fWet.clearToTarget();

    fDownsampler.Reset();
    fUpsampler.Reset();

    for (uint32_t ch = 0; ch < kNumChannels; ++ch)
        fLastDspOutputs[ch] = 0;
}